

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_7z.cpp
# Opt level: O1

SRes CZDFileInStream::Read(void *pp,void *buf,size_t *size)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = (**(code **)(**(long **)((long)pp + 0x10) + 0x10))(*(long **)((long)pp + 0x10),buf,*size);
  sVar2 = 0;
  if (0 < (long)sVar1) {
    sVar2 = sVar1;
  }
  *size = sVar2;
  return (uint)(sVar1 >> 0x3c) & 0xfffffff8;
}

Assistant:

static SRes Read(void *pp, void *buf, size_t *size)
	{
		CZDFileInStream *p = (CZDFileInStream *)pp;
		long numread = p->File->Read(buf, (long)*size);
		if (numread < 0)
		{
			*size = 0;
			return SZ_ERROR_READ;
		}
		*size = numread;
		return SZ_OK;
	}